

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeImportTableSet(TranslateToFuzzReader *this,Type type)

{
  initializer_list<wasm::Expression_*> __l;
  Name target;
  bool bVar1;
  Call *pCVar2;
  Type local_a8 [3];
  allocator<wasm::Expression_*> local_89;
  HeapType local_88;
  Type local_80;
  Type local_78;
  Expression *local_70;
  Expression *local_68;
  iterator local_60;
  size_type local_58;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_50;
  size_t local_38;
  char *pcStack_30;
  BasicType local_1c;
  TranslateToFuzzReader *local_18;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_1c = none;
  local_18 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,&local_1c);
  if (!bVar1) {
    __assert_fail("type == Type::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x4e8,"Expression *wasm::TranslateToFuzzReader::makeImportTableSet(Type)");
  }
  bVar1 = IString::operator_cast_to_bool(&(this->tableSetImportName).super_IString);
  if (!bVar1) {
    __assert_fail("tableSetImportName",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x4e9,"Expression *wasm::TranslateToFuzzReader::makeImportTableSet(Type)");
  }
  local_38 = (this->tableSetImportName).super_IString.str._M_len;
  pcStack_30 = (this->tableSetImportName).super_IString.str._M_str;
  Type::Type(&local_78,i32);
  local_70 = make(this,local_78);
  HeapType::HeapType(&local_88,func);
  Type::Type(&local_80,local_88,Nullable,Inexact);
  local_68 = makeBasicRef(this,local_80);
  local_60 = &local_70;
  local_58 = 2;
  std::allocator<wasm::Expression_*>::allocator(&local_89);
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_50,__l,&local_89);
  Type::Type(local_a8,none);
  target.super_IString.str._M_str = pcStack_30;
  target.super_IString.str._M_len = local_38;
  pCVar2 = Builder::makeCall(&this->builder,target,&local_50,local_a8[0],false);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_50);
  std::allocator<wasm::Expression_*>::~allocator(&local_89);
  return (Expression *)pCVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeImportTableSet(Type type) {
  assert(type == Type::none);
  assert(tableSetImportName);
  return builder.makeCall(
    tableSetImportName,
    {make(Type::i32), makeBasicRef(Type(HeapType::func, Nullable))},
    Type::none);
}